

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O2

void __thiscall DeflateEncoder::run(DeflateEncoder *this)

{
  ostream *poVar1;
  Lz77Encoder lz77;
  HuffmanEncoder huffman;
  string sStack_158;
  string local_138 [32];
  undefined1 local_118 [80];
  undefined1 local_c8 [184];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Deflate encryption...");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)local_c8,(string *)&(this->super_Cryptor).in_message_);
  Lz77Encoder::Lz77Encoder((Lz77Encoder *)local_118,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  Lz77Encoder::run((Lz77Encoder *)local_118);
  std::__cxx11::string::string((string *)&sStack_158,(string *)(local_118 + 0x28));
  HuffmanEncoder::HuffmanEncoder((HuffmanEncoder *)local_c8,&sStack_158);
  std::__cxx11::string::~string((string *)&sStack_158);
  HuffmanEncoder::run((HuffmanEncoder *)local_c8);
  std::__cxx11::string::string(local_138,(string *)(local_c8 + 0x28));
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,local_138);
  std::__cxx11::string::~string(local_138);
  poVar1 = std::operator<<((ostream *)&std::cout,"encryption done");
  std::endl<char,std::char_traits<char>>(poVar1);
  HuffmanEncoder::~HuffmanEncoder((HuffmanEncoder *)local_c8);
  Cryptor::~Cryptor((Cryptor *)local_118);
  return;
}

Assistant:

void DeflateEncoder::run() {
  cout << "Deflate encryption..." << endl;

  Lz77Encoder lz77(get_in_message());
  lz77.run();
  HuffmanEncoder huffman(lz77.get_out_message());
  huffman.run();
  set_out_message(huffman.get_out_message());

  cout << "encryption done" << endl;
}